

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

void __thiscall Interpreter::parseLexedDataToCommandsVector(Interpreter *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer pbVar1;
  pointer pcVar2;
  OpenDataServerCommand *pOVar3;
  DefineVarCommand *pDVar4;
  ConnectCommand *pCVar5;
  AssignVarCommand *pAVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer ppCVar9;
  bool bVar10;
  mapped_type mVar11;
  int iVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  int *piVar15;
  undefined8 uVar16;
  char *pcVar17;
  SleepCommand *unaff_R13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar18;
  pointer __x_00;
  size_type *unaff_R15;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_228;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<Command_*,_std::allocator<Command_*>_> local_d8;
  vector<Command_*,_std::allocator<Command_*>_> local_c0;
  _Base_ptr local_a8;
  string *local_a0;
  vector<Command_*,_std::allocator<Command_*>_> *local_98;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_90;
  vector<Command_*,_std::allocator<Command_*>_> *local_88;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_80;
  undefined1 local_78 [8];
  string command_string;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_string_vector;
  
  DataBase::setIsRunning(data,true);
  __x_00 = (this->lexed_data_to_interpret).
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__x_00 != (this->lexed_data_to_interpret).
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    command_string.field_2._8_8_ = &this->CMD_DICTIONARY;
    local_a8 = &(this->CMD_DICTIONARY)._M_t._M_impl.super__Rb_tree_header._M_header;
    __x = &this->condition_vector_string;
    local_88 = &this->while_commands_pointers;
    local_80 = &this->while_strings_vectors;
    local_98 = &this->if_commands_pointers;
    local_90 = &this->if_strings_vectors;
    local_a0 = (string *)&this->condition_string;
    do {
      local_78 = (undefined1  [8])&command_string._M_string_length;
      pbVar1 = (__x_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (pbVar1->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar2,pcVar2 + pbVar1->_M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,__x_00);
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
                       *)command_string.field_2._8_8_,(key_type *)local_78);
      if (iVar13._M_node == local_a8) {
        mVar11 = ASSIGN;
      }
      else {
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
                                *)command_string.field_2._8_8_,(key_type *)local_78);
        mVar11 = *pmVar14;
      }
      switch(mVar11) {
      case OPEN_DATA_SERVER:
        pOVar3 = this->open_data_server_command;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        (*(pOVar3->super_Command)._vptr_Command[1])(pOVar3,&local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
        unaff_R13 = (SleepCommand *)0x15;
        (**(this->open_data_server_command->super_Command)._vptr_Command)();
        pcVar17 = "opening a data server";
        goto LAB_001055e8;
      case CONNECT:
        pCVar5 = this->connect_command;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1e0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        (*(pCVar5->super_Command)._vptr_Command[1])(pCVar5,&local_1e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e0);
        unaff_R13 = (SleepCommand *)0x1b;
        (**(this->connect_command->super_Command)._vptr_Command)();
        pcVar17 = "connecting to the simulator";
LAB_001055e8:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar17,(long)unaff_R13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        break;
      case DEFINE_VAR:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        bVar10 = belongToCondition(this,&local_1c8,&this->define_var_command->super_Command);
        unaff_R13 = (SleepCommand *)(CONCAT71(extraout_var_00,bVar10) & 0xffffffff);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c8);
        if ((char)unaff_R13 == '\0') {
          pDVar4 = this->define_var_command;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_1b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
          (*(pDVar4->super_Command)._vptr_Command[1])(pDVar4,&local_1b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b0);
          iVar12 = pthread_mutex_trylock((pthread_mutex_t *)&data->sim_var_map_lock);
          unaff_R13 = (SleepCommand *)0x1d;
          if (iVar12 == 0) {
            iVar12 = pthread_mutex_trylock((pthread_mutex_t *)&data->in_var_map_lock);
            pcVar17 = "maps are locked by setSimData";
            if (iVar12 == 0) {
              (**(this->define_var_command->super_Command)._vptr_Command)();
LAB_001058b5:
              unaff_R13 = (SleepCommand *)0x1d;
              pthread_mutex_unlock((pthread_mutex_t *)&data->sim_var_map_lock);
              pthread_mutex_unlock((pthread_mutex_t *)&data->in_var_map_lock);
              break;
            }
          }
          else {
LAB_001055e1:
            unaff_R13 = (SleepCommand *)0x1d;
            pcVar17 = "maps are locked by setSimData";
          }
          goto LAB_001055e8;
        }
        break;
      case PRINT:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_138,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        bVar10 = belongToCondition(this,&local_138,&this->print_command->super_Command);
        unaff_R13 = (SleepCommand *)(CONCAT71(extraout_var_01,bVar10) & 0xffffffff);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_138);
        if ((char)unaff_R13 == '\0') {
          unaff_R13 = (SleepCommand *)this->print_command;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_120,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
          (*(((ConditionParser *)&unaff_R13->super_Command)->super_Command)._vptr_Command[1])
                    (unaff_R13);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_120);
          (**(this->print_command->super_Command)._vptr_Command)();
        }
        break;
      case SLEEP:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_198,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        bVar10 = belongToCondition(this,&local_198,&this->sleep_command->super_Command);
        unaff_R13 = (SleepCommand *)(CONCAT71(extraout_var,bVar10) & 0xffffffff);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198);
        if ((char)unaff_R13 == '\0') {
          unaff_R13 = this->sleep_command;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_180,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
          (*(((ConditionParser *)&unaff_R13->super_Command)->super_Command)._vptr_Command[1])
                    (unaff_R13);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_180);
          (**(this->sleep_command->super_Command)._vptr_Command)();
        }
        break;
      case ASSIGN:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_168,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
        bVar10 = belongToCondition(this,&local_168,&this->assign_var_command->super_Command);
        unaff_R13 = (SleepCommand *)(CONCAT71(extraout_var_02,bVar10) & 0xffffffff);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_168);
        if ((char)unaff_R13 == '\0') {
          pAVar6 = this->assign_var_command;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_150,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
          (*(pAVar6->super_Command)._vptr_Command[1])(pAVar6,&local_150);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_150);
          iVar12 = pthread_mutex_trylock((pthread_mutex_t *)&data->sim_var_map_lock);
          unaff_R13 = (SleepCommand *)0x1d;
          if (iVar12 != 0) goto LAB_001055e1;
          iVar12 = pthread_mutex_trylock((pthread_mutex_t *)&data->in_var_map_lock);
          pcVar17 = "maps are locked by setSimData";
          if (iVar12 == 0) {
            (**(this->assign_var_command->super_Command)._vptr_Command)();
            goto LAB_001058b5;
          }
          goto LAB_001055e8;
        }
        break;
      case WHILE:
        this->is_while_command = true;
        goto LAB_00105632;
      case IF:
        this->is_if_command = true;
        std::__cxx11::string::_M_assign(local_a0);
LAB_00105632:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(__x,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48);
        break;
      case END_CONDITION:
        if (this->is_if_command == true) {
          unaff_R13 = (SleepCommand *)operator_new(0x70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_108,__x);
          std::vector<Command_*,_std::allocator<Command_*>_>::vector(&local_d8,local_98);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::vector(&local_228,local_90);
          IfCommand::IfCommand((IfCommand *)unaff_R13,&local_108,&local_d8,&local_228);
          this->if_command = (IfCommand *)unaff_R13;
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_228);
          if (local_d8.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<Command_*,_std::allocator<Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<Command_*,_std::allocator<Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<Command_*,_std::allocator<Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_108);
          (**(this->if_command->super_ConditionParser).super_Command._vptr_Command)();
          if (this->if_command != (IfCommand *)0x0) {
            (*(this->if_command->super_ConditionParser).super_Command._vptr_Command[3])();
            this->if_command = (IfCommand *)0x0;
          }
          pvVar7 = (this->if_strings_vectors).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = (this->if_strings_vectors).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar18 = pvVar7;
          if (pvVar8 != pvVar7) {
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(pvVar18);
              unaff_R13 = (SleepCommand *)(pvVar18 + 1);
              pvVar18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)unaff_R13;
            } while (unaff_R13 != (SleepCommand *)pvVar8);
            (this->if_strings_vectors).
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
          }
          ppCVar9 = (this->if_commands_pointers).
                    super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppCVar9) {
            (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppCVar9;
          }
        }
        else if (this->is_while_command == true) {
          unaff_R13 = (SleepCommand *)operator_new(0x70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_f0,__x);
          std::vector<Command_*,_std::allocator<Command_*>_>::vector(&local_c0,local_88);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::vector(&local_210,local_80);
          WhileCommand::WhileCommand((WhileCommand *)unaff_R13,&local_f0,&local_c0,&local_210);
          this->while_command = (WhileCommand *)unaff_R13;
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_210);
          if (local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f0);
          (**(this->while_command->super_ConditionParser).super_Command._vptr_Command)();
          if (this->while_command != (WhileCommand *)0x0) {
            (*(this->while_command->super_ConditionParser).super_Command._vptr_Command[3])();
            this->while_command = (WhileCommand *)0x0;
          }
          pvVar7 = (this->while_strings_vectors).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = (this->while_strings_vectors).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar18 = pvVar7;
          if (pvVar8 != pvVar7) {
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(pvVar18);
              unaff_R13 = (SleepCommand *)(pvVar18 + 1);
              pvVar18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)unaff_R13;
            } while (unaff_R13 != (SleepCommand *)pvVar8);
            (this->while_strings_vectors).
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
          }
          ppCVar9 = (this->while_commands_pointers).
                    super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->while_commands_pointers).
              super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppCVar9) {
            (this->while_commands_pointers).
            super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
            super__Vector_impl_data._M_finish = ppCVar9;
          }
        }
        this->is_if_command = false;
        this->is_while_command = false;
      }
      unaff_R15 = &command_string._M_string_length;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      if (local_78 != (undefined1  [8])unaff_R15) {
        operator_delete((void *)local_78,command_string._M_string_length + 1);
      }
      __x_00 = __x_00 + 1;
    } while (__x_00 != (this->lexed_data_to_interpret).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  DataBase::setIsRunning(data,false);
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&data->sim_var_map_lock);
  if ((iVar12 == 0) &&
     (iVar12 = pthread_mutex_lock((pthread_mutex_t *)&data->in_var_map_lock), iVar12 == 0)) {
    local_78 = (undefined1  [8])0x2;
    command_string._M_dataplus._M_p = (pointer)0x0;
    do {
      iVar12 = nanosleep((timespec *)local_78,(timespec *)local_78);
      if (iVar12 != -1) {
        return;
      }
      piVar15 = __errno_location();
    } while (*piVar15 == 4);
    return;
  }
  uVar16 = std::__throw_system_error(iVar12);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_210);
  if (local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  operator_delete(unaff_R13,0x70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  if (local_78 != (undefined1  [8])unaff_R15) {
    operator_delete((void *)local_78,command_string._M_string_length + 1);
  }
  _Unwind_Resume(uVar16);
}

Assistant:

void Interpreter::parseLexedDataToCommandsVector() {
  int iteration = 0;
  // begin read text (boolean flag)
  data->setIsRunning(true);
  // iterate all the data that came from the lexer
  for (auto it = this->lexed_data_to_interpret.begin(); it !=
      this->lexed_data_to_interpret.end(); ++it, ++iteration) {
    // the keyword we look for to know what will be the suitable command
    string command_string = (*it)[0];
    vector<string> command_string_vector = *it;
    // the key for switch
    int commandEnum;
    // check the keyword
    if (this->CMD_DICTIONARY.find(command_string)
        != this->CMD_DICTIONARY.end()) {
      commandEnum = this->CMD_DICTIONARY[command_string];
    } else {
      commandEnum = ASSIGN;
    }
    // take a vector of strings and Execute it!
    switch (commandEnum) {
      case OPEN_DATA_SERVER: {
        this->open_data_server_command->setParameters(command_string_vector);
        this->open_data_server_command->execute();
        cout << "opening a data server" << endl;
        break;
      }
      case CONNECT: {
        this->connect_command->setParameters(command_string_vector);
        this->connect_command->execute();
        cout << "connecting to the simulator" << endl;
        break;
      }
      case DEFINE_VAR: {
        if (this->belongToCondition(command_string_vector,
                                    this->define_var_command)) {
          break;
        } else {
          this->define_var_command->setParameters(command_string_vector);
          if (data->sim_var_map_lock.try_lock()
              && data->in_var_map_lock.try_lock()) {
            this->define_var_command->execute();
            data->sim_var_map_lock.unlock();
            data->in_var_map_lock.unlock();
          } else {
            cout << "maps are locked by setSimData" << endl;
          }
          break;
        }
      }
      case SLEEP: {
        if (this
            ->belongToCondition(command_string_vector, this->sleep_command)) {
          break;
        } else {
          this->sleep_command->setParameters(command_string_vector);
          this->sleep_command->execute();
          break;
        }
      }
      case ASSIGN: {
        // case it belongs to condition
        if (this->belongToCondition(command_string_vector,
                                    this->assign_var_command)) {
          break;
        } else {
          // case its just to execute
          this->assign_var_command->setParameters(command_string_vector);
          if (data->sim_var_map_lock.try_lock()
              && data->in_var_map_lock.try_lock()) {
            this->assign_var_command->execute();
            // unlock the maps
            data->sim_var_map_lock.unlock();
            data->in_var_map_lock.unlock();
          } else {
            cout << "maps are locked by setSimData" << endl;
          }
          break;
        }
      }
      case PRINT: {
        if (this
            ->belongToCondition(command_string_vector, this->print_command)) {
          break;
        } else {
          this->print_command->setParameters(command_string_vector);
          this->print_command->execute();
          break;
        }
      }
      case WHILE: {
        this->is_while_command = true;
        // need to collect the commands in the vector :)
        this->condition_vector_string = command_string_vector;
        break;
      }
      case IF: {
        // need to collect the commands in the vector :)
        this->is_if_command = true;
        this->condition_string = command_string_vector[1];
        this->condition_vector_string = command_string_vector;
        break;
      }
      case END_CONDITION: {
        // if condition
        if (this->is_if_command) {
          // create a new if
          this->if_command = new IfCommand(this->condition_vector_string,
                                           this->if_commands_pointers,
                                           this->if_strings_vectors);
          // execute it (no set needed)
          this->if_command->execute();
          // delete the if
          if (this->if_command != nullptr) {
            delete (this->if_command);
            this->if_command = nullptr;
          }
          this->if_strings_vectors.clear();
          this->if_commands_pointers.clear();
        }
          // while condition
        else if (this->is_while_command) {
          // create a new while
          this->while_command = new WhileCommand(this->condition_vector_string,
                                                 this->while_commands_pointers,
                                                 this->while_strings_vectors);
          this->while_command->execute();
          // delete the old while
          if (this->while_command != nullptr) {
            delete (this->while_command);
            this->while_command = nullptr;
          }
          this->while_strings_vectors.clear();
          this->while_commands_pointers.clear();
        }
        this->is_if_command = false;
        this->is_while_command = false;
        break;
      }
      default: {
        break;
      }
    }
  }
  // end of text commands
  data->setIsRunning(false);
  data->sim_var_map_lock.lock();
  data->in_var_map_lock.lock();
  // give the threads time to realize its over ... (cuz its so fast)
  std::this_thread::sleep_for(chrono::seconds(2));
}